

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O0

void __thiscall StatAggregator::StatAggregator(StatAggregator *this,int _num_stats,int _num_samples)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  ulong uVar5;
  ulong *puVar6;
  stat_history_t *psVar7;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  ulong uVar8;
  int i;
  stat_history_t *this_00;
  stat_history_t *local_38;
  int local_14;
  
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  *(undefined4 *)((long)in_RDI + 0xc) = in_EDX;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)in_RDI[1];
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *in_RDI = (long)pvVar4;
  for (local_14 = 0; local_14 < (int)in_RDI[1]; local_14 = local_14 + 1) {
    uVar3 = (ulong)*(int *)((long)in_RDI + 0xc);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar5 = SUB168(auVar2 * ZEXT816(0x38),0);
    uVar8 = uVar5 + 8;
    if (SUB168(auVar2 * ZEXT816(0x38),8) != 0 || 0xfffffffffffffff7 < uVar5) {
      uVar8 = 0xffffffffffffffff;
    }
    puVar6 = (ulong *)operator_new__(uVar8);
    *puVar6 = uVar3;
    psVar7 = (stat_history_t *)(puVar6 + 1);
    if (uVar3 != 0) {
      this_00 = psVar7 + uVar3;
      local_38 = psVar7;
      do {
        stat_history_t::stat_history_t(this_00);
        local_38 = local_38 + 1;
      } while (local_38 != this_00);
    }
    *(stat_history_t **)(*in_RDI + (long)local_14 * 8) = psVar7;
  }
  return;
}

Assistant:

StatAggregator::StatAggregator(int _num_stats, int _num_samples) {

    num_stats = _num_stats;
    num_samples = _num_samples;
    t_stats = new stat_history_t*[num_stats];
    for (int i = 0; i < num_stats; ++i) {
        t_stats[i] = new stat_history_t[num_samples];
    }
}